

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall
Measurements::BenchmarkBase<Measurements::BestCase>::run_poly_vec
          (BenchmarkBase<Measurements::BestCase> *this)

{
  _func_int **pp_Var1;
  uint uVar2;
  _func_int **pp_Var3;
  
  if (this->iteration_count != 0) {
    uVar2 = 0;
    do {
      pp_Var1 = *(_func_int ***)&this[1].iteration_count;
      for (pp_Var3 = this[1].super_Benchmark._vptr_Benchmark; pp_Var3 != pp_Var1;
          pp_Var3 = pp_Var3 + 5) {
        (*(code *)**(undefined8 **)pp_Var3[2])();
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < this->iteration_count);
  }
  return;
}

Assistant:

auto     run_poly_vec()
    {
        for (auto c = 0U; c < iteration_count; c++) {
            std::for_each(
                derived().pv.begin(), derived().pv.end(), [](Interface& i) { i.doYourThing(); });
        }
    }